

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

bool __thiscall
irr::video::COpenGLDriver::setRenderTargetEx
          (COpenGLDriver *this,IRenderTarget *target,u16 clearFlag,SColor clearColor,f32 clearDepth,
          u8 clearStencil)

{
  bool bVar1;
  E_DRIVER_TYPE EVar2;
  dimension2d<unsigned_int> *pdVar3;
  STextureCache *this_00;
  undefined4 in_ECX;
  ushort in_DX;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *in_RSI;
  STextureCache *in_RDI;
  undefined1 in_R8B;
  undefined4 in_XMM0_Da;
  double __x;
  dimension2d<unsigned_int> size;
  COpenGLTexture *prevTexture;
  COpenGLTexture *renderTargetTexture;
  COpenGLRenderTarget *prevRenderTarget;
  COpenGLRenderTarget *renderTarget;
  dimension2d<unsigned_int> destRenderTargetSize;
  bool supportForFBO;
  uint in_stack_ffffffffffffff58;
  GLuint in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  *in_stack_ffffffffffffff68;
  uint local_70 [2];
  dimension2d<unsigned_int> local_68;
  dimension2d<unsigned_int> local_60;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *local_58;
  ITexture *local_50;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *local_48;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *local_40;
  uint local_34 [2];
  dimension2d<unsigned_int> local_2c;
  undefined3 in_stack_ffffffffffffffdc;
  undefined4 uVar4;
  ESetTextureActive esa;
  undefined2 in_stack_ffffffffffffffe4;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *pCVar5;
  STextureCache *this_01;
  bool local_1;
  
  uVar4 = CONCAT13(in_R8B,in_stack_ffffffffffffffdc);
  local_40 = in_RSI;
  this_01 = in_RDI;
  if ((in_RSI == (COpenGLCoreTexture<irr::video::COpenGLDriver> *)0x0) ||
     (EVar2 = IRenderTarget::getDriverType((IRenderTarget *)in_RSI), local_40 = in_RSI,
     EVar2 == EDT_OPENGL)) {
    esa = CONCAT13((char)((uint)uVar4 >> 0x18),
                   CONCAT12(*(char *)((long)&in_RDI[0x1e].TextureCount + 1) != '\0',(short)uVar4));
    local_34[1] = 0;
    local_34[0] = 0;
    core::dimension2d<unsigned_int>::dimension2d(&local_2c,local_34 + 1,local_34);
    if (local_40 == (COpenGLCoreTexture<irr::video::COpenGLDriver> *)0x0) {
      if ((esa & 0x10000) == EST_ACTIVE_ALWAYS) {
        local_48 = in_RDI[2].Texture[3];
        local_50 = COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                   ::getTexture(in_stack_ffffffffffffff68);
        pCVar5 = local_40;
        if (local_50 != (ITexture *)0x0) {
          this_00 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    ::getTextureCache((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                                       *)in_RDI[0x36].Texture[1]);
          local_58 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     ::STextureCache::operator[](this_00,0);
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::getTextureCache((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                             *)in_RDI[0x36].Texture[1]);
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::STextureCache::set
                    (this_01,(u32)((ulong)local_40 >> 0x20),
                     (ITexture *)CONCAT26(in_DX,CONCAT24(in_stack_ffffffffffffffe4,in_XMM0_Da)),esa)
          ;
          pdVar3 = ITexture::getSize(local_50);
          local_60 = *pdVar3;
          in_stack_ffffffffffffff58 = local_60.Width;
          in_stack_ffffffffffffff60 = local_60.Height;
          glCopyTexSubImage2D(0xde1,0,0,0,0);
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::getTextureCache((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                             *)in_RDI[0x36].Texture[1]);
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::STextureCache::set
                    (this_01,(u32)((ulong)local_40 >> 0x20),
                     (ITexture *)CONCAT26(in_DX,CONCAT24(in_stack_ffffffffffffffe4,in_XMM0_Da)),esa)
          ;
          pCVar5 = local_40;
        }
      }
      else {
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::setFBO((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                  *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
        pCVar5 = local_40;
      }
      local_70[1] = 0;
      local_70[0] = 0;
      core::dimension2d<unsigned_int>::dimension2d(&local_68,local_70 + 1,local_70);
      local_2c = local_68;
      (*(code *)in_RDI->CacheHandler[5].BlendSourceRGB)
                (in_RDI,*(undefined4 *)(in_RDI[5].Texture + 3),
                 *(undefined4 *)((long)in_RDI[5].Texture + 0x1c));
    }
    else {
      pCVar5 = local_40;
      if ((esa & 0x10000) != EST_ACTIVE_ALWAYS) {
        COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::getBufferID((COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                       *)local_40);
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::setFBO((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                  *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
        COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::update((COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                  *)CONCAT26(in_DX,CONCAT24(in_stack_ffffffffffffffe4,in_XMM0_Da)));
      }
      pdVar3 = COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ::getSize((COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                          *)local_40);
      local_2c = *pdVar3;
      (*(code *)in_RDI->CacheHandler[5].BlendSourceRGB)
                (in_RDI,(ulong)local_2c & 0xffffffff,local_2c.Height);
    }
    bVar1 = core::dimension2d<unsigned_int>::operator!=
                      ((dimension2d<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (dimension2d<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (bVar1) {
      in_RDI[2].TextureCount = local_2c.Width;
      *(uint *)&in_RDI[2].field_0x34 = local_2c.Height;
      *(undefined1 *)((long)in_RDI[0x3f].Texture + 0x1d) = 1;
    }
    in_RDI[2].Texture[3] = pCVar5;
    if ((esa & 0x10000) == EST_ACTIVE_ALWAYS) {
      in_DX = in_DX | 3;
    }
    (*(code *)in_RDI->CacheHandler[3].Blend)(in_XMM0_Da,in_RDI,in_DX,in_ECX,(char)(esa >> 0x18));
    local_1 = true;
  }
  else {
    os::Printer::log((Printer *)
                     "Fatal Error: Tried to set a render target not owned by this driver.",__x);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool COpenGLDriver::setRenderTargetEx(IRenderTarget *target, u16 clearFlag, SColor clearColor, f32 clearDepth, u8 clearStencil)
{
	if (target && target->getDriverType() != EDT_OPENGL) {
		os::Printer::log("Fatal Error: Tried to set a render target not owned by this driver.", ELL_ERROR);
		return false;
	}

	bool supportForFBO = (Feature.ColorAttachment > 0);

	core::dimension2d<u32> destRenderTargetSize(0, 0);

	if (target) {
		COpenGLRenderTarget *renderTarget = static_cast<COpenGLRenderTarget *>(target);

		if (supportForFBO) {
			CacheHandler->setFBO(renderTarget->getBufferID());
			renderTarget->update();
		}

		destRenderTargetSize = renderTarget->getSize();

		setViewPortRaw(destRenderTargetSize.Width, destRenderTargetSize.Height);
	} else {
		if (supportForFBO)
			CacheHandler->setFBO(0);
		else {
			COpenGLRenderTarget *prevRenderTarget = static_cast<COpenGLRenderTarget *>(CurrentRenderTarget);
			COpenGLTexture *renderTargetTexture = static_cast<COpenGLTexture *>(prevRenderTarget->getTexture());

			if (renderTargetTexture) {
				const COpenGLTexture *prevTexture = CacheHandler->getTextureCache()[0];

				CacheHandler->getTextureCache().set(0, renderTargetTexture);

				const core::dimension2d<u32> size = renderTargetTexture->getSize();
				glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, 0, size.Width, size.Height);

				CacheHandler->getTextureCache().set(0, prevTexture);
			}
		}

		destRenderTargetSize = core::dimension2d<u32>(0, 0);

		setViewPortRaw(ScreenSize.Width, ScreenSize.Height);
	}

	if (CurrentRenderTargetSize != destRenderTargetSize) {
		CurrentRenderTargetSize = destRenderTargetSize;

		Transformation3DChanged = true;
	}

	CurrentRenderTarget = target;

	if (!supportForFBO) {
		clearFlag |= ECBF_COLOR;
		clearFlag |= ECBF_DEPTH;
	}

	clearBuffers(clearFlag, clearColor, clearDepth, clearStencil);

	return true;
}